

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__stencil_clear____fx_clearstencil_common
          (ColladaParserAutoGen14Private *this)

{
  sint8 sVar1;
  byte bVar2;
  bool bVar3;
  ParserChar *in_RDI;
  bool returnValue;
  sint8 parameter;
  ParserChar *ptrForErr;
  bool failed;
  ParserChar *in_stack_000000c8;
  ParserChar *in_stack_000000d0;
  StringHash in_stack_000000d8;
  ErrorType in_stack_000000e0;
  Severity in_stack_000000e4;
  ParserTemplateBase *in_stack_000000e8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined7 in_stack_fffffffffffffff0;
  byte in_stack_fffffffffffffff7;
  
  sVar1 = GeneratedSaxParser::Utils::toSint8
                    ((ParserChar **)
                     CONCAT17(in_stack_ffffffffffffffe7,
                              CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),in_RDI,
                     (bool *)0x88da99);
  if ((in_stack_fffffffffffffff7 & 1) == 0) {
    bVar2 = (**(code **)(**(long **)(in_RDI + 0x108) + 0x1fc0))
                      (*(long **)(in_RDI + 0x108),(int)sVar1);
  }
  else {
    bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                      (in_stack_000000e8,in_stack_000000e4,in_stack_000000e0,in_stack_000000d8,
                       in_stack_000000d0,in_stack_000000c8);
    bVar2 = bVar3 ^ 0xff;
  }
  bVar2 = bVar2 & 1;
  if (*(long *)(in_RDI + 0x90) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              ((StackMemoryManager *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  }
  in_RDI[0x90] = '\0';
  in_RDI[0x91] = '\0';
  in_RDI[0x92] = '\0';
  in_RDI[0x93] = '\0';
  in_RDI[0x94] = '\0';
  in_RDI[0x95] = '\0';
  in_RDI[0x96] = '\0';
  in_RDI[0x97] = '\0';
  in_RDI[0x98] = '\0';
  in_RDI[0x99] = '\0';
  in_RDI[0x9a] = '\0';
  in_RDI[0x9b] = '\0';
  in_RDI[0x9c] = '\0';
  in_RDI[0x9d] = '\0';
  in_RDI[0x9e] = '\0';
  in_RDI[0x9f] = '\0';
  return (bool)(bVar2 & 1);
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__stencil_clear____fx_clearstencil_common()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__stencil_clear____fx_clearstencil_common();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
sint8 parameter = GeneratedSaxParser::Utils::toSint8((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__stencil_clear____fx_clearstencil_common(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_STENCIL_CLEAR, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}